

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicorn.c
# Opt level: O3

void uc_init_mips64el(uc_struct_conflict6 *uc)

{
  uc->reg_read_mips64 = reg_read_mips64el;
  uc->reg_write_mips64 = reg_write_mips64el;
  uc->reg_reset = reg_reset;
  uc->release = mips_release;
  uc->set_pc = mips_set_pc;
  uc->get_pc = mips_get_pc;
  uc->cpus_init = mips_cpus_init;
  uc->cpu_context_size = 0x3e74;
  uc->write_mem = cpu_physical_mem_write;
  uc->read_mem = cpu_physical_mem_read;
  uc->tcg_exec_init_mips64 = tcg_exec_init_mips64el;
  uc->cpu_exec_init_all_mips64 = cpu_exec_init_all_mips64el;
  uc->vm_start_mips64 = vm_start_mips64el;
  uc->memory_map_mips64 = memory_map_mips64el;
  uc->memory_map_ptr_mips64 = memory_map_ptr_mips64el;
  uc->memory_unmap_mips64 = memory_unmap_mips64el;
  uc->memory_moveout_mips64 = memory_moveout_mips64el;
  uc->memory_movein_mips64 = memory_movein_mips64el;
  uc->readonly_mem = memory_region_set_readonly_mips64el;
  uc->target_page = target_page_init;
  uc->softfloat_initialize = softfloat_init_mips64el;
  uc->tcg_flush_tlb = tcg_flush_softmmu_tlb_mips64el;
  uc->memory_map_io_mips64 = memory_map_io_mips64el;
  uc->set_tlb = uc_set_tlb;
  uc->memory_mapping = find_memory_mapping_mips64el;
  uc->memory_filter_subregions = memory_region_filter_subregions_mips64el;
  uc->memory_cow_mips64 = memory_cow_mips64el;
  return;
}

Assistant:

DEFAULT_VISIBILITY
void uc_init(struct uc_struct *uc)
{
    uc->reg_read = reg_read;
    uc->reg_write = reg_write;
    uc->reg_reset = reg_reset;
    uc->release = mips_release;
    uc->set_pc = mips_set_pc;
    uc->get_pc = mips_get_pc;
    uc->cpus_init = mips_cpus_init;
    uc->cpu_context_size = offsetof(CPUMIPSState, end_reset_fields);
    uc_common_init(uc);
}